

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void splitInterleavedSamples
               (uint8_t *inBufInterleaved,vector<float_*,_std::allocator<float_*>_> *inChannelBufs,
               int channels,int samples,int bytesPerSample)

{
  int b;
  int iVar1;
  ulong uVar2;
  byte *pbVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int c;
  ulong uVar9;
  uint32_t uSample;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar2 = (ulong)(uint)samples;
  iVar5 = 0;
  uVar7 = 0;
  if (0 < bytesPerSample) {
    uVar7 = (ulong)(uint)bytesPerSample;
  }
  uVar11 = 0;
  if (0 < channels) {
    uVar11 = (ulong)(uint)channels;
  }
  if (samples < 1) {
    uVar2 = 0;
  }
  for (uVar12 = 0; uVar12 != uVar2; uVar12 = uVar12 + 1) {
    iVar8 = iVar5;
    for (uVar9 = 0; uVar9 != uVar11; uVar9 = uVar9 + 1) {
      pbVar3 = inBufInterleaved + iVar8;
      uVar10 = 0;
      for (lVar6 = 0; uVar7 * 8 != lVar6; lVar6 = lVar6 + 8) {
        uVar10 = uVar10 | (uint)*pbVar3 << ((byte)lVar6 & 0x1f);
        pbVar3 = pbVar3 + 1;
      }
      iVar4 = bytesPerSample * 8;
      iVar1 = bytesPerSample;
      if ((uVar10 & 0x80 << ((char)(bytesPerSample * 8) - 8U & 0x1f)) != 0) {
        for (; iVar1 < 4; iVar1 = iVar1 + 1) {
          uVar10 = uVar10 | 0xff << ((byte)iVar4 & 0x1f);
          iVar4 = iVar4 + 8;
        }
      }
      (inChannelBufs->super__Vector_base<float_*,_std::allocator<float_*>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar9][uVar12] = (float)(int)uVar10;
      iVar8 = iVar8 + bytesPerSample;
    }
    iVar5 = iVar5 + channels * bytesPerSample;
  }
  return;
}

Assistant:

void splitInterleavedSamples(uint8_t *inBufInterleaved, std::vector<float*> inChannelBufs, int channels, int samples, int bytesPerSample){
	uint32_t signBit = 0x80 << ((bytesPerSample-1) * 8);
	for(int i = 0; i < samples; i++){
		for(int c = 0; c < channels; c++){
			uint32_t uSample = 0;
			for(int b = 0; b < bytesPerSample; b++){
				uSample |= ((uint32_t)inBufInterleaved[i * channels * bytesPerSample + c * bytesPerSample + b]) << (8 * b);
			}
			if(uSample & signBit){ // sign extend
				for(int b = bytesPerSample; b < 4; b++){
					uSample |= 0xff << (b * 8);
				}
			}
			inChannelBufs[c][i] = (float)(int32_t)uSample;
		}
	}
}